

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_json_check(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                     JSValue key)

{
  uint uVar1;
  int iVar2;
  ulong uVar4;
  ulong uVar5;
  int64_t iVar6;
  JSRefCountHeader *p;
  bool bVar7;
  JSValue func_obj;
  JSValue JVar8;
  JSValue JVar9;
  ulong local_78;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  JSValueUnion JVar3;
  
  if ((int)val.tag == -1) {
    JVar8 = JS_GetPropertyInternal(ctx,val,0x8e,val,0);
    JVar3 = JVar8.u;
    if ((uint)JVar8.tag == 6) {
      bVar7 = false;
    }
    else {
      iVar2 = JS_IsFunction(ctx,JVar8);
      if (iVar2 == 0) {
        local_58 = JVar3;
        if ((0xfffffff4 < (uint)JVar8.tag) &&
           (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar8);
        }
        bVar7 = true;
      }
      else {
        JVar8 = JS_CallFree(ctx,JVar8,val,1,&key);
        iVar2 = *val.u.ptr;
        *(int *)val.u.ptr = iVar2 + -1;
        if (iVar2 < 2) {
          __JS_FreeValueRT(ctx->rt,val);
        }
        bVar7 = (int)JVar8.tag != 6;
        val = JVar8;
      }
    }
    JVar8 = val;
    if (bVar7) goto LAB_0012f254;
LAB_0012f2ed:
    if ((0xfffffff4 < (uint)JVar8.tag) &&
       (iVar2 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar8);
    }
    iVar6 = 6;
  }
  else {
LAB_0012f254:
    iVar6 = (jsc->replacer_func).tag;
    if ((int)iVar6 != 3) {
      local_58 = key.u;
      iStack_50 = key.tag;
      JVar8.tag = 3;
      JVar8.u.ptr = (void *)(local_78 & 0xffffffff00000000);
      func_obj.tag = iVar6;
      func_obj.u.ptr = (jsc->replacer_func).u.ptr;
      local_48 = val;
      JVar8 = JS_CallInternal(ctx,func_obj,holder,JVar8,2,(JSValue *)&local_58,2);
      if ((0xfffffff4 < (uint)val.tag) &&
         (iVar2 = *val.u.ptr, *(int *)val.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,val);
      }
      val = JVar8;
      if ((int)JVar8.tag == 6) goto LAB_0012f2ed;
    }
    iVar6 = val.tag;
    JVar3 = val.u;
    uVar1 = (uint)val.tag + 7;
    if ((uVar1 < 0xf) &&
       (((0x6381U >> (uVar1 & 0x1f) & 1) != 0 ||
        ((uVar1 == 6 && (iVar2 = JS_IsFunction(ctx,val), iVar2 == 0)))))) {
      uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar3.ptr & 0xffffffff;
      goto LAB_0012f390;
    }
    if ((0xfffffff4 < (uint)val.tag) &&
       (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,val);
    }
    iVar6 = 3;
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_0012f390:
  JVar9.u.ptr = (void *)(uVar4 | uVar5);
  JVar9.tag = iVar6;
  return JVar9;
}

Assistant:

static JSValue js_json_check(JSContext *ctx, JSONStringifyContext *jsc,
                             JSValueConst holder, JSValue val, JSValueConst key)
{
    JSValue v;
    JSValueConst args[2];

    if (JS_IsObject(val)
#ifdef CONFIG_BIGNUM
    ||  JS_IsBigInt(ctx, val)   /* XXX: probably useless */
#endif
        ) {
            JSValue f = JS_GetProperty(ctx, val, JS_ATOM_toJSON);
            if (JS_IsException(f))
                goto exception;
            if (JS_IsFunction(ctx, f)) {
                v = JS_CallFree(ctx, f, val, 1, &key);
                JS_FreeValue(ctx, val);
                val = v;
                if (JS_IsException(val))
                    goto exception;
            } else {
                JS_FreeValue(ctx, f);
            }
        }

    if (!JS_IsUndefined(jsc->replacer_func)) {
        args[0] = key;
        args[1] = val;
        v = JS_Call(ctx, jsc->replacer_func, holder, 2, args);
        JS_FreeValue(ctx, val);
        val = v;
        if (JS_IsException(val))
            goto exception;
    }

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        if (JS_IsFunction(ctx, val))
            break;
    case JS_TAG_STRING:
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
#endif
    case JS_TAG_EXCEPTION:
        return val;
    default:
        break;
    }
    JS_FreeValue(ctx, val);
    return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}